

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void ts_tree_edit(TSTree *self,TSInputEdit *edit)

{
  TSRange *pTVar1;
  long lVar2;
  Subtree SVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  SubtreePool pool;
  SubtreePool local_38;
  
  if (self->included_range_count != 0) {
    lVar2 = 0x14;
    uVar4 = 0;
    do {
      pTVar1 = self->included_ranges;
      uVar5 = *(uint *)((long)&(pTVar1->start_point).row + lVar2);
      if (edit->old_end_byte <= uVar5) {
        if (uVar5 != 0xffffffff) {
          uVar5 = (uVar5 - edit->old_end_byte) + edit->new_end_byte;
          *(uint *)((long)&(pTVar1->start_point).row + lVar2) = uVar5;
          uVar7 = *(ulong *)((long)pTVar1 + lVar2 + -0xc);
          uVar8 = (edit->old_end_point).row;
          if (uVar8 < (uint)uVar7) {
            uVar7 = (ulong)((uint)uVar7 - uVar8) | uVar7 & 0xffffffff00000000;
          }
          else {
            uVar7 = uVar7 - ((ulong)edit->old_end_point & 0xffffffff00000000) & 0xffffffff00000000;
          }
          uVar6 = (long)edit->new_end_point + uVar7;
          uVar9 = uVar6 & 0xffffffff | uVar7 & 0xffffffff00000000;
          if ((int)uVar7 == 0) {
            uVar9 = uVar6;
          }
          *(ulong *)((long)pTVar1 + lVar2 + -0xc) = uVar9;
          if (uVar5 < edit->new_end_byte) {
            *(undefined4 *)((long)&(pTVar1->start_point).row + lVar2) = 0xffffffff;
            *(undefined8 *)((long)pTVar1 + lVar2 + -0xc) = 0xffffffffffffffff;
          }
        }
        uVar5 = *(uint *)((long)pTVar1 + lVar2 + -4);
        if (edit->old_end_byte <= uVar5) {
          uVar5 = (uVar5 - edit->old_end_byte) + edit->new_end_byte;
          *(uint *)((long)pTVar1 + lVar2 + -4) = uVar5;
          uVar7 = *(ulong *)((long)pTVar1 + lVar2 + -0x14);
          uVar8 = (edit->old_end_point).row;
          if (uVar8 < (uint)uVar7) {
            uVar7 = (ulong)((uint)uVar7 - uVar8) | uVar7 & 0xffffffff00000000;
          }
          else {
            uVar7 = uVar7 - ((ulong)edit->old_end_point & 0xffffffff00000000) & 0xffffffff00000000;
          }
          uVar6 = (long)edit->new_end_point + uVar7;
          uVar9 = uVar6 & 0xffffffff | uVar7 & 0xffffffff00000000;
          if ((int)uVar7 == 0) {
            uVar9 = uVar6;
          }
          *(ulong *)((long)pTVar1 + lVar2 + -0x14) = uVar9;
          if (uVar5 < edit->new_end_byte) {
            *(undefined4 *)((long)pTVar1 + lVar2 + -4) = 0xffffffff;
            *(undefined8 *)((long)pTVar1 + lVar2 + -0x14) = 0xffffffffffffffff;
          }
        }
      }
      uVar4 = uVar4 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar4 < self->included_range_count);
  }
  local_38.tree_stack.contents = (MutableSubtree *)0x0;
  local_38.tree_stack.size = 0;
  local_38.tree_stack.capacity = 0;
  local_38.free_trees.contents = (MutableSubtree *)0x0;
  local_38.free_trees.size = 0;
  local_38.free_trees.capacity = 0;
  SVar3 = ts_subtree_edit(*(SubtreeInlineData *)&self->root,edit,&local_38);
  self->root = SVar3;
  self->parent_cache_start = 0;
  self->parent_cache_size = 0;
  ts_subtree_pool_delete(&local_38);
  return;
}

Assistant:

void ts_tree_edit(TSTree *self, const TSInputEdit *edit) {
  for (unsigned i = 0; i < self->included_range_count; i++) {
    TSRange *range = &self->included_ranges[i];
    if (range->end_byte >= edit->old_end_byte) {
      if (range->end_byte != UINT32_MAX) {
        range->end_byte = edit->new_end_byte + (range->end_byte - edit->old_end_byte);
        range->end_point = point_add(
          edit->new_end_point,
          point_sub(range->end_point, edit->old_end_point)
        );
        if (range->end_byte < edit->new_end_byte) {
          range->end_byte = UINT32_MAX;
          range->end_point = POINT_MAX;
        }
      }
      if (range->start_byte >= edit->old_end_byte) {
        range->start_byte = edit->new_end_byte + (range->start_byte - edit->old_end_byte);
        range->start_point = point_add(
          edit->new_end_point,
          point_sub(range->start_point, edit->old_end_point)
        );
        if (range->start_byte < edit->new_end_byte) {
          range->start_byte = UINT32_MAX;
          range->start_point = POINT_MAX;
        }
      }
    }
  }

  SubtreePool pool = ts_subtree_pool_new(0);
  self->root = ts_subtree_edit(self->root, edit, &pool);
  self->parent_cache_start = 0;
  self->parent_cache_size = 0;
  ts_subtree_pool_delete(&pool);
}